

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O1

void __thiscall VectorsTest_FP3Lesser_Test::TestBody(VectorsTest_FP3Lesser_Test *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VectorsTest, FP3Lesser)
{
    FP3 v1(13, 25, 21), v2(6, 8, 2), v3(14, 6, 1);
    ASSERT_FALSE(v1 < v2);
    ASSERT_TRUE(v2 < v1);
    ASSERT_FALSE(v1 < v3);
    ASSERT_FALSE(v3 < v1);
    ASSERT_FALSE(v2 < v3);
    ASSERT_FALSE(v3 < v2);
}